

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O0

int secp256k1_bulletproof_inner_product_real_prove_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,secp256k1_ge *out_pt,
              size_t *pt_idx,secp256k1_ge *g,secp256k1_ge *geng,secp256k1_ge *genh,
              secp256k1_scalar *a_arr,secp256k1_scalar *b_arr,secp256k1_scalar *yinv,
              secp256k1_scalar *ux,size_t n,uchar *commit)

{
  int iVar1;
  secp256k1_scalar *x;
  secp256k1_ge *in_RCX;
  secp256k1_scratch *in_RDX;
  secp256k1_ecmult_context *in_RSI;
  size_t *in_R8;
  secp256k1_ge *in_R9;
  secp256k1_ge *unaff_retaddr;
  secp256k1_scalar *in_stack_00000008;
  secp256k1_scalar *in_stack_00000010;
  secp256k1_scalar *in_stack_00000018;
  secp256k1_scalar *in_stack_00000020;
  size_t in_stack_00000028;
  uchar *in_stack_00000030;
  secp256k1_gej rj;
  secp256k1_scalar yinv2;
  secp256k1_scalar tmps;
  secp256k1_scalar prod_1;
  secp256k1_scalar prod;
  int overflow;
  size_t j;
  secp256k1_gej tmprj;
  secp256k1_gej tmplj;
  secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
  size_t halfwidth;
  size_t i;
  secp256k1_scalar *in_stack_fffffffffffff500;
  uchar *in_stack_fffffffffffff508;
  secp256k1_scalar *in_stack_fffffffffffff510;
  secp256k1_scalar *in_stack_fffffffffffff520;
  secp256k1_scalar *in_stack_fffffffffffff528;
  secp256k1_scalar *in_stack_fffffffffffff530;
  secp256k1_scalar *in_stack_fffffffffffff538;
  secp256k1_scalar *in_stack_fffffffffffff540;
  secp256k1_gej *in_stack_fffffffffffff548;
  secp256k1_ge *in_stack_fffffffffffff550;
  secp256k1_ge *in_stack_fffffffffffff590;
  secp256k1_ge *in_stack_fffffffffffff598;
  uchar *in_stack_fffffffffffff5a0;
  void *in_stack_fffffffffffff600;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffff608;
  secp256k1_scalar *in_stack_fffffffffffff610;
  secp256k1_gej *in_stack_fffffffffffff618;
  secp256k1_scratch *in_stack_fffffffffffff620;
  secp256k1_ecmult_context *in_stack_fffffffffffff628;
  int local_9cc;
  secp256k1_ge *local_9c8;
  size_t in_stack_fffffffffffff640;
  secp256k1_scalar local_8c0 [62];
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  secp256k1_scalar sStack_e0;
  secp256k1_ge *local_c0;
  secp256k1_scalar *local_b8;
  secp256k1_scalar sStack_98;
  ulong local_78;
  ulong local_68;
  secp256k1_ge *geng_00;
  int local_24;
  
  local_100 = in_stack_00000020->d[0];
  local_f8 = in_stack_00000020->d[1];
  local_f0 = in_stack_00000020->d[2];
  local_e8 = in_stack_00000020->d[3];
  local_b8 = in_stack_00000008;
  local_68 = (ulong)in_stack_00000030 >> 1;
  geng_00 = (secp256k1_ge *)0x0;
  local_c0 = in_R9;
  while( true ) {
    if (local_68 < 2) goto LAB_00131590;
    local_78 = (ulong)(uint)(1 << ((byte)geng_00 & 0x1f));
    secp256k1_scalar_clear(&sStack_98);
    for (local_9c8 = (secp256k1_ge *)0x0; local_9c8 < local_68;
        local_9c8 = (secp256k1_ge *)((long)local_9c8 + 1)) {
      secp256k1_scalar_mul
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
      secp256k1_scalar_add
                (in_stack_fffffffffffff530,in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    }
    secp256k1_scalar_mul
              (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
    secp256k1_scalar_set_int(&sStack_e0,1);
    secp256k1_ecmult_multi_var
              (in_stack_fffffffffffff628,in_stack_fffffffffffff620,in_stack_fffffffffffff618,
               in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
               in_stack_fffffffffffff640);
    (in_RCX->x).n[0] = (in_RCX->x).n[0] + 1;
    secp256k1_ge_set_gej(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    secp256k1_scalar_clear(&sStack_98);
    for (local_9c8 = (secp256k1_ge *)0x0; local_9c8 < local_68;
        local_9c8 = (secp256k1_ge *)((long)local_9c8 + 1)) {
      secp256k1_scalar_mul
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
      secp256k1_scalar_add
                (in_stack_fffffffffffff530,in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    }
    secp256k1_scalar_mul
              (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
    secp256k1_scalar_set_int(&sStack_e0,1);
    x = (secp256k1_scalar *)(in_stack_00000030 + 1);
    secp256k1_ecmult_multi_var
              (in_stack_fffffffffffff628,in_stack_fffffffffffff620,in_stack_fffffffffffff618,
               in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
               in_stack_fffffffffffff640);
    (in_RCX->x).n[0] = (in_RCX->x).n[0] + 1;
    secp256k1_ge_set_gej(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    secp256k1_bulletproof_update_commit
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590);
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508,(int *)in_stack_fffffffffffff500)
    ;
    if ((local_9cc != 0) ||
       (iVar1 = secp256k1_scalar_is_zero(local_8c0 + (long)geng_00), iVar1 != 0)) {
      return 0;
    }
    secp256k1_scalar_inverse_var(in_stack_fffffffffffff500,x);
    for (local_9c8 = (secp256k1_ge *)0x0; local_9c8 < local_68;
        local_9c8 = (secp256k1_ge *)((long)local_9c8 + 1)) {
      secp256k1_scalar_mul
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
      secp256k1_scalar_mul
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
      secp256k1_scalar_add
                (in_stack_fffffffffffff530,in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      secp256k1_scalar_mul
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
      secp256k1_scalar_mul
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
      secp256k1_scalar_add
                (in_stack_fffffffffffff530,in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    }
    if (((((uchar *)0x800 < in_stack_00000030) && (geng_00 == (secp256k1_ge *)0x3)) ||
        (((uchar *)0x80 < in_stack_00000030 && (geng_00 == (secp256k1_ge *)0x2)))) ||
       (((uchar *)0x20 < in_stack_00000030 && (geng_00 == (secp256k1_ge *)0x1)))) break;
    local_68 = local_68 >> 1;
    geng_00 = (secp256k1_ge *)((long)(geng_00->x).n + 1);
  }
  for (local_9c8 = (secp256k1_ge *)0x0; local_9c8 < local_68;
      local_9c8 = (secp256k1_ge *)((long)local_9c8 + 1)) {
    secp256k1_ecmult_multi_var
              (in_stack_fffffffffffff628,in_stack_fffffffffffff620,in_stack_fffffffffffff618,
               in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
               in_stack_fffffffffffff640);
    local_c0 = local_c0 + (uint)(2 << ((byte)geng_00 & 0x1f));
    secp256k1_ge_set_gej(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    secp256k1_scalar_set_int(&sStack_e0,1);
    secp256k1_ecmult_multi_var
              (in_stack_fffffffffffff628,in_stack_fffffffffffff620,in_stack_fffffffffffff618,
               in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
               in_stack_fffffffffffff640);
    local_b8 = (secp256k1_scalar *)
               ((long)local_b8 + (ulong)(uint)(2 << ((byte)geng_00 & 0x1f)) * 0x58);
    secp256k1_ge_set_gej(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  }
  secp256k1_scalar_sqr(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  for (local_9c8 = (secp256k1_ge *)0x0; local_9c8 < geng_00;
      local_9c8 = (secp256k1_ge *)((long)(local_9c8->x).n + 1)) {
    secp256k1_scalar_sqr(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  }
  iVar1 = secp256k1_bulletproof_inner_product_real_prove_impl
                    (in_RSI,in_RDX,in_RCX,in_R8,in_R9,geng_00,unaff_retaddr,in_stack_00000008,
                     in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                     in_stack_00000030);
  if (iVar1 == 0) {
    local_24 = 0;
  }
  else {
LAB_00131590:
    local_24 = 1;
  }
  return local_24;
}

Assistant:

static int secp256k1_bulletproof_inner_product_real_prove_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, secp256k1_ge *out_pt, size_t *pt_idx, const secp256k1_ge *g, secp256k1_ge *geng, secp256k1_ge *genh, secp256k1_scalar *a_arr, secp256k1_scalar *b_arr, const secp256k1_scalar *yinv, const secp256k1_scalar *ux, const size_t n, unsigned char *commit) {
    size_t i;
    size_t halfwidth;

    secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
    pfdata.yinv = *yinv;
    pfdata.g = g;
    pfdata.geng = geng;
    pfdata.genh = genh;
    pfdata.a = a_arr;
    pfdata.b = b_arr;
    pfdata.n = n;

    /* Protocol 1: Iterate, halving vector size until it is 1 */
    for (halfwidth = n / 2, i = 0; halfwidth > IP_AB_SCALARS / 4; halfwidth /= 2, i++) {
        secp256k1_gej tmplj, tmprj;
        size_t j;
        int overflow;

        pfdata.grouping = 1u << i;

        /* L */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j], &b_arr[2*j + 1]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmplj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmplj);

        /* R */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j + 1], &b_arr[2*j]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmprj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmprj);

        /* x, x^2, x^-1, x^-2 */
        secp256k1_bulletproof_update_commit(commit, &out_pt[*pt_idx - 2], &out_pt[*pt_idx] - 1);
        secp256k1_scalar_set_b32(&pfdata.x[i], commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&pfdata.x[i])) {
            return 0;
        }
        secp256k1_scalar_inverse_var(&pfdata.xinv[i], &pfdata.x[i]);

        /* update scalar array */
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar tmps;
            secp256k1_scalar_mul(&a_arr[2*j], &a_arr[2*j], &pfdata.x[i]);
            secp256k1_scalar_mul(&tmps, &a_arr[2*j + 1], &pfdata.xinv[i]);
            secp256k1_scalar_add(&a_arr[j], &a_arr[2*j], &tmps);

            secp256k1_scalar_mul(&b_arr[2*j], &b_arr[2*j], &pfdata.xinv[i]);
            secp256k1_scalar_mul(&tmps, &b_arr[2*j + 1], &pfdata.x[i]);
            secp256k1_scalar_add(&b_arr[j], &b_arr[2*j], &tmps);

        }

        /* Combine G generators and recurse, if that would be more optimal */
        if ((n > 2048 && i == 3) || (n > 128 && i == 2) || (n > 32 && i == 1)) {
            secp256k1_scalar yinv2;

            for (j = 0; j < halfwidth; j++) {
                secp256k1_gej rj;
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g, (void *) &pfdata, 2u << i);
                pfdata.geng += 2u << i;
                secp256k1_ge_set_gej(&geng[j], &rj);
                secp256k1_scalar_set_int(&pfdata.yinvn, 1);
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h, (void *) &pfdata, 2u << i);
                pfdata.genh += 2u << i;
                secp256k1_ge_set_gej(&genh[j], &rj);
            }

            secp256k1_scalar_sqr(&yinv2, yinv);
            for (j = 0; j < i; j++) {
                secp256k1_scalar_sqr(&yinv2, &yinv2);
            }
            if (!secp256k1_bulletproof_inner_product_real_prove_impl(ecmult_ctx, scratch, out_pt, pt_idx, g, geng, genh, a_arr, b_arr, &yinv2, ux, halfwidth, commit)) {
                return 0;
            }
            break;
        }
    }
    return 1;
}